

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

string * __thiscall
Liby::Buffer::retriveveAsString_abi_cxx11_(string *__return_storage_ptr__,Buffer *this,off_t len)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  
  if (-1 < len) {
    lVar1 = this->leftIndex_;
    lVar2 = this->rightIndex_;
    lVar4 = lVar2 - lVar1;
    do {
      if (len == 0) {
        if (lVar2 < lVar1) goto LAB_0010ec6a;
      }
      else {
        if (lVar2 < lVar1) {
LAB_0010ec6a:
          __assert_fail("rightIndex_ >= leftIndex_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                        ,0x5a,"off_t Liby::Buffer::size() const");
        }
        if (len <= lVar4) {
          pcVar3 = data(this);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,pcVar3,pcVar3 + len);
          retrieve(this,len);
          return __return_storage_ptr__;
        }
      }
      len = lVar4;
    } while (-1 < lVar4);
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0xf9,"std::string Liby::Buffer::retriveveAsString(off_t)");
}

Assistant:

std::string Buffer::retriveveAsString(off_t len) {
    assert(len >= 0);
    if (len == 0 || len > size())
        return retriveveAsString(size());
    std::string ret(data(), len);
    retrieve(len);
    return ret;
}